

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O1

void axl::sl::shlBitMap(size_t *map,size_t pageCount,size_t n)

{
  byte bVar1;
  size_t __n;
  size_t *psVar2;
  size_t *psVar3;
  ulong uVar4;
  
  if (n == 0) {
    return;
  }
  uVar4 = n >> 6;
  if (pageCount < uVar4 || pageCount - uVar4 == 0) {
    __n = pageCount << 3;
  }
  else {
    if ((n & 0x3f) == 0) {
      memmove(map + uVar4,map,(pageCount - uVar4) * 8);
    }
    else {
      psVar2 = map + (pageCount - 1);
      psVar3 = psVar2 + -uVar4;
      if (map <= psVar3 + -1) {
        psVar3 = map + pageCount;
        do {
          psVar2 = psVar3;
          bVar1 = (byte)n & 0x3f;
          psVar2[-1] = psVar2[-1 - uVar4] << bVar1 | psVar2[-2 - uVar4] >> 0x40 - bVar1;
          psVar3 = psVar2 + -1;
        } while (map <= psVar2 + (-3 - uVar4));
        psVar2 = psVar2 + -2;
        psVar3 = psVar2 + -uVar4;
      }
      *psVar2 = *psVar3 << (sbyte)(n & 0x3f);
      if (n < 0x40) {
        return;
      }
    }
    __n = uVar4 << 3;
  }
  memset(map,0,__n);
  return;
}

Assistant:

void
shlBitMap(
	size_t* map,
	size_t pageCount,
	size_t n
) {
	if (!n)
		return;

	size_t i = n / AXL_PTR_BITS;
	if (i >= pageCount) {
		memset(map, 0, pageCount * sizeof(size_t));
		return;
	}

	n &= AXL_PTR_BITS - 1;
	if (!n) {
		memmove(map + i, map, (pageCount - i) * sizeof(size_t));
		memset(map, 0, i * sizeof(size_t));
		return;
	}

	size_t c = AXL_PTR_BITS - n;
	size_t* dst = map + pageCount - 1;
	size_t* src = dst - i;
	size_t* prev = src - 1;
	while (prev >= map) {
		*dst-- = (*src << n) | (*prev >> c);
		src = prev--;
	}

	*dst = *src << n;

	if (i)
		memset(map, 0, i * sizeof(size_t));
}